

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int GetSentenceVector(void *hPtr,char *input,float **vector)

{
  int iVar1;
  float *__dest;
  allocator<char> local_1d1;
  Vector svec;
  string local_1c0 [32];
  istringstream inStream;
  
  iVar1 = fasttext::FastText::getDimension((FastText *)hPtr);
  fasttext::Vector::Vector(&svec,(long)iVar1);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,input,&local_1d1);
  std::__cxx11::istringstream::istringstream((istringstream *)&inStream,local_1c0,_S_in);
  std::__cxx11::string::~string(local_1c0);
  fasttext::FastText::getSentenceVector((FastText *)hPtr,(istream *)&inStream,&svec);
  __dest = (float *)operator_new__(-(ulong)(svec.data_.size_ >> 0x3e != 0) | svec.data_.size_ * 4);
  memcpy(__dest,svec.data_.mem_,svec.data_.size_ * 4);
  *vector = __dest;
  std::__cxx11::istringstream::~istringstream((istringstream *)&inStream);
  free(svec.data_.mem_);
  return (int)svec.data_.size_;
}

Assistant:

GetSentenceVector(void* hPtr, const char* input, float** vector)
{
    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    Vector svec(fastText->getDimension());
    std::istringstream inStream(input);

    try {
        fastText->getSentenceVector(inStream, svec);
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }

    auto vec = new float[svec.size()];
    size_t sz = sizeof(float)*svec.size();
    memcpy(vec, svec.data(), sz);

    *vector = vec;

    return (int) svec.size();
}